

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O0

void siphash_test(void *input,int len,uint32_t seed,void *out)

{
  uint64_t uVar1;
  uint64_t *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  uchar *in_RDI;
  uchar key [16];
  undefined1 local_28 [16];
  uint64_t *local_18;
  
  local_18 = in_RCX;
  memset(local_28,0,0x10);
  if (in_ESI == 0) {
    *(undefined4 *)local_18 = 0;
  }
  else {
    uVar1 = siphash((uchar *)key._0_8_,in_RDI,CONCAT44(in_ESI,in_EDX));
    *local_18 = uVar1;
  }
  return;
}

Assistant:

void
siphash_test(const void *input, int len, uint32_t seed, void *out)
{
  /* 128bit state, filled with a 32bit seed */
  unsigned char	key[16] = {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0};
  if (!len) {
    *(uint32_t *) out = 0;
    return;
  }
  memcpy(key, &seed, sizeof(seed));
  // objsize: 0-0x42f: 1071
  *(uint64_t *) out = siphash(key, (const unsigned char *)input, (size_t) len);
}